

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O1

void icetDataReplicationGroup(IceTInt size,IceTInt *processes)

{
  undefined8 in_RAX;
  long lVar1;
  IceTInt rank;
  int local_18;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  local_18 = size;
  icetGetIntegerv(2,&local_14);
  if (0 < (long)local_18) {
    lVar1 = 0;
    do {
      if (processes[lVar1] == local_14) {
        icetStateSetIntegerv(0x2d,1,&local_18);
        icetStateSetIntegerv(0x2c,local_18,processes);
        return;
      }
      lVar1 = lVar1 + 1;
    } while (local_18 != lVar1);
  }
  icetRaiseDiagnostic("Local process not part of data replication group.",0xfffffffa,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                      ,0x7e);
  return;
}

Assistant:

void icetDataReplicationGroup(IceTInt size, const IceTInt *processes)
{
    IceTInt rank;
    IceTBoolean found_myself = ICET_FALSE;
    IceTInt i;

    icetGetIntegerv(ICET_RANK, &rank);
    for (i = 0; i < size; i++) {
        if (processes[i] == rank) {
            found_myself = ICET_TRUE;
            break;
        }
    }

    if (!found_myself) {
        icetRaiseError("Local process not part of data replication group.",
                       ICET_INVALID_VALUE);
        return;
    }

    icetStateSetIntegerv(ICET_DATA_REPLICATION_GROUP_SIZE, 1, &size);
    icetStateSetIntegerv(ICET_DATA_REPLICATION_GROUP, size, processes);
}